

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O2

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxFrame[]>(mmd *this,size_t n)

{
  undefined1 auVar1 [16];
  size_t *psVar2;
  ulong uVar3;
  long lVar4;
  PmxFrame *this_00;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x50),8) == 0) {
    uVar3 = SUB168(auVar1 * ZEXT816(0x50),0) | 8;
  }
  psVar2 = (size_t *)operator_new__(uVar3);
  *psVar2 = n;
  if (n != 0) {
    lVar4 = n * 0x50;
    this_00 = (PmxFrame *)(psVar2 + 1);
    do {
      pmx::PmxFrame::PmxFrame(this_00);
      this_00 = this_00 + 1;
      lVar4 = lVar4 + -0x50;
    } while (lVar4 != 0);
  }
  *(PmxFrame **)this = (PmxFrame *)(psVar2 + 1);
  return (__uniq_ptr_data<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>,_true,_true>)
         (__uniq_ptr_data<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>,_true,_true>)this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }